

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GTIN.cpp
# Opt level: O2

string * ZXing::GTIN::IssueNr(string *__return_storage_ptr__,string *ean2AddOn)

{
  int __val;
  
  if (ean2AddOn->_M_string_length == 2) {
    __val = std::__cxx11::stoi(ean2AddOn,(size_t *)0x0,10);
    std::__cxx11::to_string(__return_storage_ptr__,__val);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string IssueNr(const std::string& ean2AddOn)
{
	if (ean2AddOn.size() != 2)
		return {};

	return std::to_string(std::stoi(ean2AddOn));
}